

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

unique_ptr<pbrt::SimplePathIntegrator,_std::default_delete<pbrt::SimplePathIntegrator>_>
pbrt::SimplePathIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  bool bVar1;
  int iVar2;
  bool sampleLights;
  bool sampleBSDF;
  allocator<char> local_5d;
  int maxDepth;
  string local_58;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *local_38;
  
  local_38 = lights;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"maxdepth",(allocator<char> *)&sampleLights);
  iVar2 = ParameterDictionary::GetOneInt((ParameterDictionary *)camera,&local_58,5);
  std::__cxx11::string::~string((string *)&local_58);
  maxDepth = iVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"samplelights",(allocator<char> *)&sampleBSDF);
  bVar1 = ParameterDictionary::GetOneBool((ParameterDictionary *)camera,&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  sampleLights = bVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"samplebsdf",&local_5d);
  bVar1 = ParameterDictionary::GetOneBool((ParameterDictionary *)camera,&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  sampleBSDF = bVar1;
  std::
  make_unique<pbrt::SimplePathIntegrator,int&,bool&,bool&,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&>
            ((int *)parameters,(bool *)&maxDepth,&sampleLights,(CameraHandle *)&sampleBSDF,sampler,
             aggregate,local_38);
  return (__uniq_ptr_data<pbrt::SimplePathIntegrator,_std::default_delete<pbrt::SimplePathIntegrator>,_true,_true>
          )(__uniq_ptr_data<pbrt::SimplePathIntegrator,_std::default_delete<pbrt::SimplePathIntegrator>,_true,_true>
            )parameters;
}

Assistant:

std::unique_ptr<SimplePathIntegrator> SimplePathIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    bool sampleLights = parameters.GetOneBool("samplelights", true);
    bool sampleBSDF = parameters.GetOneBool("samplebsdf", true);
    return std::make_unique<SimplePathIntegrator>(maxDepth, sampleLights, sampleBSDF,
                                                  camera, sampler, aggregate, lights);
}